

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O1

astcenc_image * imageAllocate(uint32_t bitness,uint32_t dim_x,uint32_t dim_y,uint32_t dim_z)

{
  astcenc_image *paVar1;
  void **ppvVar2;
  void *pvVar3;
  
  paVar1 = (astcenc_image *)operator_new(0x18);
  paVar1->dim_x = bitness;
  paVar1->dim_y = dim_x;
  paVar1->dim_z = 1;
  ppvVar2 = (void **)operator_new__(8);
  paVar1->data_type = ASTCENC_TYPE_U8;
  paVar1->data = ppvVar2;
  pvVar3 = operator_new__((ulong)(bitness * dim_x * 4));
  *ppvVar2 = pvVar3;
  return paVar1;
}

Assistant:

static astcenc_image*
imageAllocate(uint32_t bitness,
              uint32_t dim_x, uint32_t dim_y, uint32_t dim_z) {
    astcenc_image *img = new astcenc_image;
    assert(img);

    img->dim_x         = dim_x;
    img->dim_y         = dim_y;
    img->dim_z         = dim_z;

    if (bitness == 8) {
        void **data    = new void *[dim_z];
        img->data_type = ASTCENC_TYPE_U8;
        img->data      = data;

        for (uint32_t z = 0; z < dim_z; z++) {
            data[z] = new uint8_t[dim_x * dim_y * 4];
        }
    }
    else if (bitness == 16) {
        void **data    = new void *[dim_z];
        img->data_type = ASTCENC_TYPE_F16;
        img->data      = data;

        for (uint32_t z = 0; z < dim_z; z++) {
            data[z] = new uint16_t[dim_x * dim_y * 4];
        }
    }
    else {       // if (bitness == 32)
        assert(bitness == 32);
        void **data    = new void *[dim_z];
        img->data_type = ASTCENC_TYPE_F32;
        img->data      = data;

        for (uint32_t z = 0; z < dim_z; z++) {
            data[z] = new float[dim_x * dim_y * 4];
        }
    }

    return img;
}